

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

void test_all_maps<HashObject<16,16>>(int obj_size,int iters)

{
  pointer ppVar1;
  _Rb_tree_node_base *p_Var2;
  float fVar3;
  pointer psVar4;
  iterator iVar5;
  nonempty_iterator ppVar6;
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *psVar7;
  long lVar8;
  long lVar9;
  value_type *pvVar10;
  iterator iVar11;
  value_type *pvVar12;
  uint *puVar13;
  iterator iVar14;
  __node_base _Var15;
  _Base_ptr p_Var16;
  int iVar17;
  pointer ppVar18;
  iterator iVar19;
  undefined1 *puVar20;
  pointer ppVar21;
  pointer end_memory;
  size_t end_memory_00;
  key_type *__k;
  pointer ppVar22;
  size_t start_memory;
  size_t start_memory_00;
  undefined1 *puVar23;
  size_t start_memory_01;
  size_t start_memory_02;
  key_type *pkVar24;
  size_t start_memory_03;
  size_t start_memory_04;
  _Base_ptr p_Var25;
  size_t start_memory_05;
  size_t start_memory_06;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  size_type req_elements;
  _Base_ptr p_Var29;
  pointer ppVar30;
  uint uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_HashObject<16,_16>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_HashObject<16,_16>,_int>_>_>
  pVar50;
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> set;
  undefined1 local_148 [4];
  undefined1 auStack_144 [20];
  iterator iStack_130;
  pointer local_128;
  iterator iStack_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  nonempty_iterator local_108;
  undefined1 local_100 [16];
  __node_base local_f0;
  _Base_ptr p_Stack_e8;
  _Base_ptr local_e0;
  size_t local_d8;
  __node_base_ptr p_Stack_d0;
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  local_c8;
  size_type local_b0;
  pointer local_a0;
  ulong local_98;
  pointer local_90;
  sparse_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  local_88;
  HashObject<16,_16> local_40;
  
  ppVar30 = (pointer)(ulong)(uint)obj_size;
  ppVar18 = ppVar30;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",0x10);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar27 = 0;
    do {
      lVar9 = (uVar27 & 0xff) * 0x101010101010101;
      ppVar18 = (pointer)(local_148 + 4);
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])(uint)uVar27;
      pvVar10 = google::
                sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(key_type *)local_148);
      uVar26 = (uint)uVar27 + 1;
      uVar27 = (ulong)uVar26;
      pvVar10->second = uVar26;
    } while (obj_size != uVar26);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar49._0_8_ - lVar8),obj_size,auVar49._8_8_,(size_t)ppVar18);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_c8);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  req_elements = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)local_100,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar26 = 0;
    do {
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      ppVar18 = (pointer)(local_148 + 4);
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      pvVar10 = google::
                sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(key_type *)local_148);
      uVar26 = uVar26 + 1;
      pvVar10->second = uVar26;
    } while (obj_size != uVar26);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar49._0_8_ - lVar8),obj_size,auVar49._8_8_,(size_t)ppVar18);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_c8);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar26 = 0;
    do {
      lVar8 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      pvVar10 = google::
                sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(key_type *)local_148);
      uVar26 = uVar26 + 1;
      pvVar10->second = uVar26;
    } while (obj_size != uVar26);
  }
  uVar26 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    do {
      ppVar18 = (pointer)0x101010101010101;
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      pvVar10 = google::
                sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(key_type *)local_148);
      uVar26 = uVar26 + 1;
      pvVar10->second = uVar26;
    } while (obj_size != uVar26);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar49._0_8_ - lVar8),obj_size,auVar49._8_8_,(size_t)ppVar18);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_c8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_100,req_elements,(allocator_type *)local_148
            );
  auVar49 = _DAT_0013b020;
  local_98 = (ulong)(uint)obj_size;
  if (0 < obj_size) {
    ppVar18 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    lVar8 = local_98 - 1;
    auVar33._8_4_ = (int)lVar8;
    auVar33._0_8_ = lVar8;
    auVar33._12_4_ = (int)((ulong)lVar8 >> 0x20);
    ppVar22 = (pointer)0x0;
    auVar33 = auVar33 ^ _DAT_0013b020;
    auVar48 = _DAT_0013b010;
    do {
      auVar47 = auVar48 ^ auVar49;
      if ((bool)(~(auVar33._4_4_ < auVar47._4_4_ ||
                  auVar33._0_4_ < auVar47._0_4_ && auVar47._4_4_ == auVar33._4_4_) & 1)) {
        *(int *)(local_100._0_8_ + (long)ppVar22 * 4) = (int)ppVar22;
      }
      if (auVar47._12_4_ <= auVar33._12_4_ &&
          (auVar47._8_4_ <= auVar33._8_4_ || auVar47._12_4_ != auVar33._12_4_)) {
        *(int *)(local_100._0_8_ + (long)ppVar22 * 4 + 4) = (int)ppVar22 + 1;
      }
      ppVar22 = (pointer)((long)&(ppVar22->first).i_ + 2);
      lVar8 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + 2;
      auVar48._8_8_ = lVar8 + 2;
    } while (ppVar18 != ppVar22);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_100);
  time_map_fetch<EasyUseSparseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_100,"map_fetch_random");
  if ((__buckets_ptr)local_100._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_100._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_100,req_elements,(allocator_type *)local_148
            );
  auVar49 = _DAT_0013b020;
  if (0 < obj_size) {
    ppVar18 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    lVar8 = local_98 - 1;
    auVar34._8_4_ = (int)lVar8;
    auVar34._0_8_ = lVar8;
    auVar34._12_4_ = (int)((ulong)lVar8 >> 0x20);
    ppVar22 = (pointer)0x0;
    auVar34 = auVar34 ^ _DAT_0013b020;
    auVar47 = _DAT_0013b010;
    do {
      auVar48 = auVar47 ^ auVar49;
      if ((bool)(~(auVar34._4_4_ < auVar48._4_4_ ||
                  auVar34._0_4_ < auVar48._0_4_ && auVar48._4_4_ == auVar34._4_4_) & 1)) {
        *(int *)(local_100._0_8_ + (long)ppVar22 * 4) = (int)ppVar22;
      }
      if (auVar48._12_4_ <= auVar34._12_4_ &&
          (auVar48._8_4_ <= auVar34._8_4_ || auVar48._12_4_ != auVar34._12_4_)) {
        *(int *)(local_100._0_8_ + (long)ppVar22 * 4 + 4) = (int)ppVar22 + 1;
      }
      ppVar22 = (pointer)((long)&(ppVar22->first).i_ + 2);
      lVar8 = auVar47._8_8_;
      auVar47._0_8_ = auVar47._0_8_ + 2;
      auVar47._8_8_ = lVar8 + 2;
    } while (ppVar18 != ppVar22);
  }
  time_map_fetch<EasyUseSparseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_100,"map_fetch_sequential");
  if ((__buckets_ptr)local_100._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_100._0_8_);
  }
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar26 = 1;
  }
  else {
    uVar26 = 1;
    uVar31 = 0;
    do {
      local_40.buffer_._0_8_ = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      local_40.buffer_._8_4_ = SUB84(local_40.buffer_._0_8_,0);
      local_40.i_ = uVar31;
      google::
      sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
      ::find<HashObject<16,16>>
                ((iterator *)local_148,
                 (sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                  *)local_100,&local_40);
      local_88.pos.row_begin._M_current._0_4_ =
           SUB84(local_c8.
                 super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0);
      local_88.pos.row_begin._M_current._4_4_ =
           (undefined4)
           ((ulong)local_c8.
                   super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 0x20);
      local_88.pos.row_end._M_current =
           local_c8.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.pos.row_current._M_current =
           local_c8.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.pos.col_current = (pointer)0x0;
      local_88.end.row_begin._M_current =
           local_c8.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_88.end.row_end._M_current =
           local_c8.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.end.row_current._M_current =
           local_c8.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.end.col_current = (nonempty_iterator)0x0;
      local_88.ht = (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                     *)local_100;
      google::
      sparse_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::advance_past_deleted(&local_88);
      uVar28 = 1;
      ppVar18 = (pointer)CONCAT44(auStack_144._8_4_,auStack_144._4_4_);
      if ((((pointer)CONCAT44(auStack_144._8_4_,auStack_144._4_4_) ==
            (pointer)CONCAT44(local_88.pos.row_begin._M_current._4_4_,
                              local_88.pos.row_begin._M_current._0_4_)) &&
          (ppVar18 = (pointer)auStack_144._12_8_,
          (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           *)auStack_144._12_8_ == local_88.pos.row_end._M_current)) &&
         (iStack_130._M_current == local_88.pos.row_current._M_current)) {
        if (iStack_130._M_current ==
            (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             *)auStack_144._12_8_) {
          uVar28 = 0;
        }
        else {
          uVar28 = (uint)(local_128 != local_88.pos.col_current);
          ppVar18 = local_128;
        }
      }
      uVar26 = uVar26 ^ uVar28;
      uVar31 = uVar31 + 1;
    } while (obj_size != uVar31);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar26);
  report("map_fetch_empty",(double)(lVar9 - lVar8),obj_size,start_memory,(size_t)ppVar18);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_c8);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar27 = 0;
    do {
      ppVar18 = (pointer)0x101010101010101;
      lVar8 = (uVar27 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])(uint)uVar27;
      pvVar10 = google::
                sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(key_type *)local_148);
      uVar26 = (uint)uVar27 + 1;
      uVar27 = (ulong)uVar26;
      pvVar10->second = uVar26;
    } while (obj_size != uVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar26 = 0;
    do {
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      ppVar18 = (pointer)(local_148 + 4);
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      google::
      sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_100,(key_type *)local_148);
      uVar26 = uVar26 + 1;
    } while (obj_size != uVar26);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar49._0_8_ - lVar8),obj_size,auVar49._8_8_,(size_t)ppVar18);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_c8);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  local_90 = ppVar30;
  if (0 < obj_size) {
    ppVar18 = (pointer)local_148;
    uVar26 = 0;
    do {
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      pvVar10 = google::
                sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(key_type *)ppVar18);
      uVar31 = uVar26 + 1;
      pvVar10->second = uVar31;
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      local_148 = (undefined1  [4])uVar26;
      auStack_144._8_4_ = auStack_144._0_4_;
      google::
      sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_100,(key_type *)ppVar18);
      obj_size = (int)local_90;
      uVar26 = uVar31;
    } while (uVar31 != obj_size);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar49._0_8_ - lVar8),obj_size,auVar49._8_8_,(size_t)ppVar18);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_c8);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar26 = 0;
    do {
      lVar8 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      pvVar10 = google::
                sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(key_type *)local_148);
      uVar26 = uVar26 + 1;
      pvVar10->second = uVar26;
    } while (obj_size != uVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar9 = std::chrono::_V2::steady_clock::now();
  google::
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::begin(&local_88,
          (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           *)local_100);
  auStack_144[4] = (char)local_88.pos.row_begin._M_current;
  auStack_144[5] = local_88.pos.row_begin._M_current._1_1_;
  auStack_144[6] = local_88.pos.row_begin._M_current._2_1_;
  auStack_144[7] = local_88.pos.row_begin._M_current._3_1_;
  auStack_144[8] = local_88.pos.row_begin._M_current._4_1_;
  auStack_144[9] = local_88.pos.row_begin._M_current._5_1_;
  auStack_144[10] = local_88.pos.row_begin._M_current._6_1_;
  auStack_144[0xb] = local_88.pos.row_begin._M_current._7_1_;
  auStack_144._12_8_ = local_88.pos.row_end._M_current;
  iStack_130._M_current = local_88.pos.row_current._M_current;
  local_128 = local_88.pos.col_current;
  iStack_120._M_current = local_88.end.row_begin._M_current;
  local_118 = local_88.end.row_end._M_current._0_4_;
  uStack_114 = local_88.end.row_end._M_current._4_4_;
  uStack_110 = local_88.end.row_current._M_current._0_4_;
  uStack_10c = local_88.end.row_current._M_current._4_4_;
  local_108 = local_88.end.col_current;
  local_88.pos.row_begin._M_current._0_4_ =
       SUB84(local_c8.
             super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_88.pos.row_begin._M_current._4_4_ =
       (undefined4)
       ((ulong)local_c8.
               super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  local_88.pos.row_end._M_current =
       local_c8.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.pos.row_current._M_current =
       local_c8.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.pos.col_current = (pointer)0x0;
  local_88.end.row_begin._M_current =
       local_c8.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.end.row_end._M_current =
       local_c8.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.end.row_current._M_current =
       local_c8.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.end.col_current = (nonempty_iterator)0x0;
  psVar7 = (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)local_100;
  _local_148 = (dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                *)local_88.ht;
  google::
  sparse_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::advance_past_deleted(&local_88);
  local_88.ht = psVar7;
  ppVar6 = local_88.pos.col_current;
  iVar5._M_current = local_88.pos.row_current._M_current;
  iVar19._M_current = local_88.pos.row_end._M_current;
  lVar8 = CONCAT44(local_88.pos.row_begin._M_current._4_4_,local_88.pos.row_begin._M_current._0_4_);
  uVar26 = 1;
  while (((CONCAT44(auStack_144._8_4_,auStack_144._4_4_) != lVar8 ||
          ((sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)auStack_144._12_8_ != iVar19._M_current)) ||
         ((iStack_130._M_current != iVar5._M_current ||
          ((iStack_130._M_current !=
            (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             *)auStack_144._12_8_ && (local_128 != ppVar6))))))) {
    uVar26 = uVar26 ^ local_128->second;
    local_128 = local_128 + 1;
    iVar11._M_current = iStack_130._M_current;
    if (local_128 ==
        (pointer)(*(long *)&(iStack_130._M_current)->group +
                 (ulong)((uint)((iStack_130._M_current)->settings).num_buckets * 0x14))) {
      do {
        iVar11._M_current = iStack_130._M_current + 1;
        if (iVar11._M_current ==
            (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             *)auStack_144._12_8_) break;
        local_128 = (iVar11._M_current)->group;
        psVar4 = iStack_130._M_current + 1;
        iStack_130._M_current = iVar11._M_current;
      } while ((psVar4->settings).num_buckets == 0);
    }
    iStack_130._M_current = iVar11._M_current;
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                *)local_148);
  }
  iVar19._M_current = iStack_130._M_current;
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar26);
  ppVar18 = local_90;
  uVar31 = (uint)local_90;
  report("map_iterate",(double)(lVar8 - lVar9),uVar31,start_memory_00,(size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_c8);
  uVar26 = 0;
  puVar20 = (undefined1 *)((ulong)ppVar18 & 0xffffffff);
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",0x10);
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar31) {
    do {
      puVar20 = (undefined1 *)0x101010101010101;
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(HashObject<16,_16> *)local_148);
      uVar26 = uVar26 + 1;
      pvVar12->second = uVar26;
    } while (uVar31 != uVar26);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar49._0_8_ - lVar8),uVar31,auVar49._8_8_,(size_t)puVar20);
  if (local_a0 != (pointer)0x0) {
    free(local_a0);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  google::
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)local_100,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar31) {
    uVar26 = 0;
    do {
      puVar20 = (undefined1 *)0x101010101010101;
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(HashObject<16,_16> *)local_148);
      uVar26 = uVar26 + 1;
      pvVar12->second = uVar26;
    } while (uVar31 != uVar26);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar49._0_8_ - lVar8),uVar31,auVar49._8_8_,(size_t)puVar20);
  if (local_a0 != (pointer)0x0) {
    free(local_a0);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar31) {
    uVar26 = 0;
    do {
      lVar8 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      puVar20 = local_148 + 4;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(HashObject<16,_16> *)local_148);
      uVar26 = uVar26 + 1;
      pvVar12->second = uVar26;
    } while (uVar31 != uVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar31) {
    uVar26 = 0;
    do {
      puVar20 = (undefined1 *)0x101010101010101;
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(HashObject<16,_16> *)local_148);
      uVar26 = uVar26 + 1;
      pvVar12->second = uVar26;
    } while (uVar31 != uVar26);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar49._0_8_ - lVar8),uVar31,auVar49._8_8_,(size_t)puVar20);
  if (local_a0 != (pointer)0x0) {
    free(local_a0);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_100,req_elements,(allocator_type *)local_148
            );
  auVar49 = _DAT_0013b020;
  if (0 < (int)uVar31) {
    puVar20 = (undefined1 *)(ulong)(uVar31 + 1 & 0xfffffffe);
    lVar8 = local_98 - 1;
    auVar35._8_4_ = (int)lVar8;
    auVar35._0_8_ = lVar8;
    auVar35._12_4_ = (int)((ulong)lVar8 >> 0x20);
    puVar23 = (undefined1 *)0x0;
    auVar35 = auVar35 ^ _DAT_0013b020;
    auVar41 = _DAT_0013b010;
    do {
      auVar48 = auVar41 ^ auVar49;
      if ((bool)(~(auVar35._4_4_ < auVar48._4_4_ ||
                  auVar35._0_4_ < auVar48._0_4_ && auVar48._4_4_ == auVar35._4_4_) & 1)) {
        *(int *)(local_100._0_8_ + (long)puVar23 * 4) = (int)puVar23;
      }
      if (auVar48._12_4_ <= auVar35._12_4_ &&
          (auVar48._8_4_ <= auVar35._8_4_ || auVar48._12_4_ != auVar35._12_4_)) {
        *(int *)(local_100._0_8_ + (long)puVar23 * 4 + 4) = (int)puVar23 + 1;
      }
      puVar23 = puVar23 + 2;
      lVar8 = auVar41._8_8_;
      auVar41._0_8_ = auVar41._0_8_ + 2;
      auVar41._8_8_ = lVar8 + 2;
    } while (puVar20 != puVar23);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_100);
  time_map_fetch<EasyUseDenseHashMap<HashObject<16,16>,int,HashFn>>
            (uVar31,(vector<int,_std::allocator<int>_> *)local_100,"map_fetch_random");
  if ((__buckets_ptr)local_100._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_100._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_100,req_elements,(allocator_type *)local_148
            );
  auVar49 = _DAT_0013b020;
  if (0 < (int)uVar31) {
    puVar20 = (undefined1 *)(ulong)(uVar31 + 1 & 0xfffffffe);
    lVar8 = local_98 - 1;
    auVar36._8_4_ = (int)lVar8;
    auVar36._0_8_ = lVar8;
    auVar36._12_4_ = (int)((ulong)lVar8 >> 0x20);
    puVar23 = (undefined1 *)0x0;
    auVar36 = auVar36 ^ _DAT_0013b020;
    auVar42 = _DAT_0013b010;
    do {
      auVar48 = auVar42 ^ auVar49;
      if ((bool)(~(auVar36._4_4_ < auVar48._4_4_ ||
                  auVar36._0_4_ < auVar48._0_4_ && auVar48._4_4_ == auVar36._4_4_) & 1)) {
        *(int *)(local_100._0_8_ + (long)puVar23 * 4) = (int)puVar23;
      }
      if (auVar48._12_4_ <= auVar36._12_4_ &&
          (auVar48._8_4_ <= auVar36._8_4_ || auVar48._12_4_ != auVar36._12_4_)) {
        *(int *)(local_100._0_8_ + (long)puVar23 * 4 + 4) = (int)puVar23 + 1;
      }
      puVar23 = puVar23 + 2;
      lVar8 = auVar42._8_8_;
      auVar42._0_8_ = auVar42._0_8_ + 2;
      auVar42._8_8_ = lVar8 + 2;
    } while (puVar20 != puVar23);
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<16,16>,int,HashFn>>
            (uVar31,(vector<int,_std::allocator<int>_> *)local_100,"map_fetch_sequential");
  if ((__buckets_ptr)local_100._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_100._0_8_);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  uVar26 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  uVar28 = 1;
  if (0 < (int)uVar31) {
    do {
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      local_88.ht._4_4_ = (undefined4)lVar9;
      local_88.pos.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      local_88.pos.row_begin._M_current._4_4_ = local_88.ht._4_4_;
      local_88.ht._0_4_ = uVar26;
      google::
      dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
      ::find<HashObject<16,16>>
                ((iterator *)local_148,
                 (dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                  *)local_100,(HashObject<16,_16> *)&local_88);
      bVar32 = (pointer)CONCAT44(auStack_144._8_4_,auStack_144._4_4_) != local_a0 + local_b0;
      puVar20 = (undefined1 *)(ulong)bVar32;
      uVar28 = uVar28 ^ bVar32;
      uVar26 = uVar26 + 1;
    } while ((uint)local_90 != uVar26);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar28);
  ppVar18 = local_90;
  uVar26 = (uint)local_90;
  report("map_fetch_empty",(double)(lVar9 - lVar8),uVar26,start_memory_01,(size_t)puVar20);
  if (local_a0 != (pointer)0x0) {
    free(local_a0);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      lVar8 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      puVar20 = local_148 + 4;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(HashObject<16,_16> *)local_148);
      uVar31 = uVar31 + 1;
      pvVar12->second = uVar31;
    } while (uVar26 != uVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      puVar20 = (undefined1 *)0x101010101010101;
      lVar9 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      google::
      dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
    } while (uVar26 != uVar31);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)puVar20);
  if (local_a0 != (pointer)0x0) {
    free(local_a0);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      puVar20 = local_148 + 4;
      lVar9 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(HashObject<16,_16> *)local_148);
      uVar28 = uVar31 + 1;
      pvVar12->second = uVar28;
      lVar9 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      local_148 = (undefined1  [4])uVar31;
      auStack_144._8_4_ = auStack_144._0_4_;
      google::
      dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_100,(HashObject<16,_16> *)local_148);
      uVar31 = uVar28;
    } while (uVar28 != uVar26);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)puVar20);
  if (local_a0 != (pointer)0x0) {
    free(local_a0);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_100);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      lVar8 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_100,(HashObject<16,_16> *)local_148);
      uVar31 = uVar31 + 1;
      pvVar12->second = uVar31;
    } while (uVar26 != uVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  ppVar1 = local_a0 + local_b0;
  end_memory = local_a0;
  if (local_b0 != 0) {
    lVar9 = local_b0 * 0x14;
    do {
      fVar3 = (float)(end_memory->first).i_;
      if ((p_Stack_d0._0_4_ != fVar3) &&
         (local_c8.
          super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0 || local_e0._0_4_ != fVar3))
      break;
      end_memory = end_memory + 1;
      lVar9 = lVar9 + -0x14;
    } while (lVar9 != 0);
  }
  if (end_memory == ppVar1) {
    uVar31 = 1;
  }
  else {
    uVar31 = 1;
    ppVar21 = end_memory;
LAB_00121c96:
    do {
      end_memory = end_memory + 1;
      if (end_memory != ppVar1) {
        fVar3 = (float)(end_memory->first).i_;
        if ((p_Stack_d0._0_4_ == fVar3) ||
           (local_c8.
            super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0 && local_e0._0_4_ == fVar3))
        goto LAB_00121c96;
      }
      uVar31 = uVar31 ^ ppVar21->second;
      ppVar21 = end_memory;
    } while (end_memory != ppVar1);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar31);
  report("map_iterate",(double)(lVar9 - lVar8),uVar26,start_memory_02,(size_t)end_memory);
  if (local_a0 != (pointer)0x0) {
    free(local_a0);
  }
  __k = (key_type *)((ulong)ppVar18 & 0xffffffff);
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",0x10);
  local_100._0_8_ = &p_Stack_d0;
  local_100._8_8_ = (pointer)0x1;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_e8 = (_Base_ptr)0x0;
  local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,1.0);
  local_d8 = 0;
  p_Stack_d0 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      lVar9 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      __k = (key_type *)(local_148 + 4);
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)__k);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_100);
  local_100._0_8_ = &p_Stack_d0;
  local_100._8_8_ = (pointer)0x1;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_e8 = (_Base_ptr)0x0;
  local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,1.0);
  local_d8 = 0;
  p_Stack_d0 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)local_100,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      lVar9 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      __k = (key_type *)(local_148 + 4);
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)__k);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_100);
  local_100._0_8_ = &p_Stack_d0;
  local_100._8_8_ = (pointer)0x1;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_e8 = (_Base_ptr)0x0;
  local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,1.0);
  local_d8 = 0;
  p_Stack_d0 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      lVar8 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
  }
  uVar31 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if ((int)uVar26 < 1) {
    auVar49 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)__k);
    std::
    _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_100);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_100,req_elements,
               (allocator_type *)local_148);
  }
  else {
    do {
      end_memory_00 = 0x101010101010101;
      lVar9 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
    auVar49 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,end_memory_00);
    std::
    _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_100);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_100,req_elements,
               (allocator_type *)local_148);
    auVar49 = _DAT_0013b020;
    __k = (key_type *)(ulong)(uVar26 + 1 & 0xfffffffe);
    lVar8 = local_98 - 1;
    auVar37._8_4_ = (int)lVar8;
    auVar37._0_8_ = lVar8;
    auVar37._12_4_ = (int)((ulong)lVar8 >> 0x20);
    pkVar24 = (key_type *)0x0;
    auVar37 = auVar37 ^ _DAT_0013b020;
    auVar43 = _DAT_0013b010;
    do {
      auVar48 = auVar43 ^ auVar49;
      if ((bool)(~(auVar37._4_4_ < auVar48._4_4_ ||
                  auVar37._0_4_ < auVar48._0_4_ && auVar48._4_4_ == auVar37._4_4_) & 1)) {
        *(int *)(local_100._0_8_ + (long)pkVar24 * 4) = (int)pkVar24;
      }
      if (auVar48._12_4_ <= auVar37._12_4_ &&
          (auVar48._8_4_ <= auVar37._8_4_ || auVar48._12_4_ != auVar37._12_4_)) {
        *(int *)(local_100._0_8_ + (long)pkVar24 * 4 + 4) = (int)pkVar24 + 1;
      }
      pkVar24 = (key_type *)((long)&pkVar24->i_ + 2);
      lVar8 = auVar43._8_8_;
      auVar43._0_8_ = auVar43._0_8_ + 2;
      auVar43._8_8_ = lVar8 + 2;
    } while (__k != pkVar24);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_100);
  time_map_fetch<EasyUseHashMap<HashObject<16,16>,int,HashFn>>
            (uVar26,(vector<int,_std::allocator<int>_> *)local_100,"map_fetch_random");
  if ((__node_base_ptr *)local_100._0_8_ != (__node_base_ptr *)0x0) {
    operator_delete((void *)local_100._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_100,req_elements,(allocator_type *)local_148
            );
  auVar49 = _DAT_0013b020;
  if (0 < (int)uVar26) {
    __k = (key_type *)(ulong)(uVar26 + 1 & 0xfffffffe);
    lVar8 = local_98 - 1;
    auVar38._8_4_ = (int)lVar8;
    auVar38._0_8_ = lVar8;
    auVar38._12_4_ = (int)((ulong)lVar8 >> 0x20);
    pkVar24 = (key_type *)0x0;
    auVar38 = auVar38 ^ _DAT_0013b020;
    auVar44 = _DAT_0013b010;
    do {
      auVar48 = auVar44 ^ auVar49;
      if ((bool)(~(auVar38._4_4_ < auVar48._4_4_ ||
                  auVar38._0_4_ < auVar48._0_4_ && auVar48._4_4_ == auVar38._4_4_) & 1)) {
        *(int *)(local_100._0_8_ + (long)pkVar24 * 4) = (int)pkVar24;
      }
      if (auVar48._12_4_ <= auVar38._12_4_ &&
          (auVar48._8_4_ <= auVar38._8_4_ || auVar48._12_4_ != auVar38._12_4_)) {
        *(int *)(local_100._0_8_ + (long)pkVar24 * 4 + 4) = (int)pkVar24 + 1;
      }
      pkVar24 = (key_type *)((long)&pkVar24->i_ + 2);
      lVar8 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + 2;
      auVar44._8_8_ = lVar8 + 2;
    } while (__k != pkVar24);
  }
  time_map_fetch<EasyUseHashMap<HashObject<16,16>,int,HashFn>>
            (uVar26,(vector<int,_std::allocator<int>_> *)local_100,"map_fetch_sequential");
  if ((__node_base_ptr *)local_100._0_8_ != (__node_base_ptr *)0x0) {
    operator_delete((void *)local_100._0_8_);
  }
  local_100._0_8_ = &p_Stack_d0;
  local_100._8_8_ = (pointer)0x1;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_e8 = (_Base_ptr)0x0;
  local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,1.0);
  local_d8 = 0;
  p_Stack_d0 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  uVar31 = 1;
  if (0 < (int)uVar26) {
    uVar28 = 0;
    do {
      lVar9 = (ulong)(uVar28 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar28;
      iVar14 = std::
               _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_100,(key_type *)local_148);
      __k = (key_type *)
            (ulong)(iVar14.super__Node_iterator_base<std::pair<const_HashObject<16,_16>,_int>,_true>
                    ._M_cur != (__node_type *)0x0);
      uVar31 = uVar31 ^ iVar14.
                        super__Node_iterator_base<std::pair<const_HashObject<16,_16>,_int>,_true>.
                        _M_cur != (__node_type *)0x0;
      uVar28 = uVar28 + 1;
    } while (uVar26 != uVar28);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar31);
  report("map_fetch_empty",(double)(lVar9 - lVar8),uVar26,start_memory_03,(size_t)__k);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_100);
  local_100._0_8_ = &p_Stack_d0;
  local_100._8_8_ = (pointer)0x1;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_e8 = (_Base_ptr)0x0;
  local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,1.0);
  local_d8 = 0;
  p_Stack_d0 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      __k = (key_type *)0x101010101010101;
      lVar8 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      lVar9 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      __k = (key_type *)(local_148 + 4);
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      std::
      _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_100,local_148);
      uVar31 = uVar31 + 1;
    } while (uVar26 != uVar31);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)__k);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_100);
  local_100._0_8_ = &p_Stack_d0;
  local_100._8_8_ = (pointer)0x1;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_e8 = (_Base_ptr)0x0;
  local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,1.0);
  local_d8 = 0;
  p_Stack_d0 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    __k = (key_type *)local_148;
    uVar26 = 0;
    do {
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_100,__k);
      uVar31 = uVar26 + 1;
      *puVar13 = uVar31;
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      local_148 = (undefined1  [4])uVar26;
      auStack_144._8_4_ = auStack_144._0_4_;
      std::
      _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_100,__k);
      ppVar18 = local_90;
      uVar26 = uVar31;
    } while (uVar31 != (uint)local_90);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  uVar26 = (uint)ppVar18;
  report("map_toggle",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)__k);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_100);
  local_100._0_8_ = &p_Stack_d0;
  local_100._8_8_ = (pointer)0x1;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_e8 = (_Base_ptr)0x0;
  local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,1.0);
  local_d8 = 0;
  p_Stack_d0 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      lVar8 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      __k = (key_type *)(local_148 + 4);
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  uVar31 = 1;
  for (_Var15._M_nxt = local_f0._M_nxt; _Var15._M_nxt != (_Hash_node_base *)0x0;
      _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt) {
    uVar31 = uVar31 ^ *(uint *)&_Var15._M_nxt[3]._M_nxt;
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar31);
  report("map_iterate",(double)(lVar9 - lVar8),uVar26,start_memory_04,(size_t)__k);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_100);
  puVar20 = (undefined1 *)((ulong)ppVar18 & 0xffffffff);
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",0x10);
  p_Stack_e8 = (_Base_ptr)(local_100 + 8);
  local_100._8_8_ = local_100._8_8_ & 0xffffffff00000000;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  local_d8 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_e0 = p_Stack_e8;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      lVar9 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      puVar20 = local_148 + 4;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)puVar20);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_100);
  local_100._8_8_ = local_100._8_8_ & 0xffffffff00000000;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_e8 = (_Base_ptr)(local_100 + 8);
  local_d8 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_e0 = p_Stack_e8;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      puVar20 = (undefined1 *)0x101010101010101;
      lVar9 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)puVar20);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_100);
  local_100._8_8_ = local_100._8_8_ & 0xffffffff00000000;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_e8 = (_Base_ptr)(local_100 + 8);
  local_d8 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_e0 = p_Stack_e8;
  std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      lVar8 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      puVar20 = local_148 + 4;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if ((int)uVar26 < 1) {
    auVar49 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)puVar20);
    std::
    _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                 *)local_100);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_100,req_elements,
               (allocator_type *)local_148);
  }
  else {
    uVar31 = 0;
    do {
      puVar20 = (undefined1 *)0x101010101010101;
      lVar9 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
    auVar49 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)puVar20);
    std::
    _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                 *)local_100);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_100,req_elements,
               (allocator_type *)local_148);
    auVar49 = _DAT_0013b020;
    _local_148 = (dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                  *)CONCAT44(auStack_144._0_4_,local_148);
    if (0 < (int)uVar26) {
      puVar20 = (undefined1 *)(ulong)(uVar26 + 1 & 0xfffffffe);
      lVar8 = local_98 - 1;
      auVar39._8_4_ = (int)lVar8;
      auVar39._0_8_ = lVar8;
      auVar39._12_4_ = (int)((ulong)lVar8 >> 0x20);
      puVar23 = (undefined1 *)0x0;
      auVar39 = auVar39 ^ _DAT_0013b020;
      auVar45 = _DAT_0013b010;
      do {
        auVar48 = auVar45 ^ auVar49;
        if ((bool)(~(auVar48._4_4_ == auVar39._4_4_ && auVar39._0_4_ < auVar48._0_4_ ||
                    auVar39._4_4_ < auVar48._4_4_) & 1)) {
          *(int *)(local_100._0_8_ + (long)puVar23 * 4) = (int)puVar23;
        }
        if ((auVar48._12_4_ != auVar39._12_4_ || auVar48._8_4_ <= auVar39._8_4_) &&
            auVar48._12_4_ <= auVar39._12_4_) {
          *(int *)(local_100._0_8_ + (long)puVar23 * 4 + 4) = (int)puVar23 + 1;
        }
        puVar23 = puVar23 + 2;
        lVar8 = auVar45._8_8_;
        auVar45._0_8_ = auVar45._0_8_ + 2;
        auVar45._8_8_ = lVar8 + 2;
        _local_148 = (dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                      *)CONCAT44(auStack_144._0_4_,local_148);
      } while (puVar20 != puVar23);
    }
  }
  p_Var16 = (_Base_ptr)(local_100 + 8);
  shuffle((vector<int,_std::allocator<int>_> *)local_100);
  time_map_fetch<EasyUseMap<HashObject<16,16>,int>>
            (uVar26,(vector<int,_std::allocator<int>_> *)local_100,"map_fetch_random");
  if ((__node_base_ptr *)local_100._0_8_ != (__node_base_ptr *)0x0) {
    operator_delete((void *)local_100._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_100,req_elements,(allocator_type *)local_148
            );
  auVar49 = _DAT_0013b020;
  if (0 < (int)uVar26) {
    puVar20 = (undefined1 *)(ulong)(uVar26 + 1 & 0xfffffffe);
    lVar8 = local_98 - 1;
    auVar40._8_4_ = (int)lVar8;
    auVar40._0_8_ = lVar8;
    auVar40._12_4_ = (int)((ulong)lVar8 >> 0x20);
    puVar23 = (undefined1 *)0x0;
    auVar40 = auVar40 ^ _DAT_0013b020;
    auVar46 = _DAT_0013b010;
    do {
      auVar48 = auVar46 ^ auVar49;
      if ((bool)(~(auVar48._4_4_ == auVar40._4_4_ && auVar40._0_4_ < auVar48._0_4_ ||
                  auVar40._4_4_ < auVar48._4_4_) & 1)) {
        *(int *)(local_100._0_8_ + (long)puVar23 * 4) = (int)puVar23;
      }
      if ((auVar48._12_4_ != auVar40._12_4_ || auVar48._8_4_ <= auVar40._8_4_) &&
          auVar48._12_4_ <= auVar40._12_4_) {
        *(int *)(local_100._0_8_ + (long)puVar23 * 4 + 4) = (int)puVar23 + 1;
      }
      puVar23 = puVar23 + 2;
      lVar8 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + 2;
      auVar46._8_8_ = lVar8 + 2;
    } while (puVar20 != puVar23);
  }
  time_map_fetch<EasyUseMap<HashObject<16,16>,int>>
            (uVar26,(vector<int,_std::allocator<int>_> *)local_100,"map_fetch_sequential");
  if ((__node_base_ptr *)local_100._0_8_ != (__node_base_ptr *)0x0) {
    operator_delete((void *)local_100._0_8_);
  }
  local_100._8_8_ = local_100._8_8_ & 0xffffffff00000000;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  local_d8 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  p_Stack_e8 = p_Var16;
  local_e0 = p_Var16;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  uVar31 = 1;
  if (0 < (int)uVar26) {
    puVar20 = (undefined1 *)0x0;
    do {
      iVar17 = (int)puVar20;
      p_Var25 = p_Var16;
      for (_Var15._M_nxt = local_f0._M_nxt; (_Base_ptr)_Var15._M_nxt != (_Base_ptr)0x0;
          _Var15._M_nxt =
               (_Hash_node_base *)
               (&((_Base_ptr)_Var15._M_nxt)->_M_left)
               [(int)((_Base_ptr)((long)_Var15._M_nxt + 0x20))->_M_color < iVar17]) {
        if (iVar17 <= (int)((_Base_ptr)((long)_Var15._M_nxt + 0x20))->_M_color) {
          p_Var25 = (_Base_ptr)_Var15._M_nxt;
        }
      }
      p_Var29 = p_Var16;
      if ((p_Var25 != p_Var16) && (p_Var29 = p_Var25, iVar17 < (int)p_Var25[1]._M_color)) {
        p_Var29 = p_Var16;
      }
      uVar31 = uVar31 ^ p_Var29 != p_Var16;
      puVar20 = (undefined1 *)(ulong)(iVar17 + 1U);
    } while (iVar17 + 1U != uVar26);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar31);
  report("map_fetch_empty",(double)(lVar9 - lVar8),uVar26,start_memory_05,(size_t)puVar20);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_100);
  p_Stack_e8 = (_Base_ptr)(local_100 + 8);
  local_100._8_8_ = local_100._8_8_ & 0xffffffff00000000;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  local_d8 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_e0 = p_Stack_e8;
  std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar27 = 0;
    do {
      puVar20 = (undefined1 *)0x101010101010101;
      lVar8 = (uVar27 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])(int)uVar27;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_100,(key_type *)local_148);
      uVar31 = (int)uVar27 + 1;
      uVar27 = (ulong)uVar31;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar27 = 0;
    do {
      lVar9 = (uVar27 & 0xff) * 0x101010101010101;
      puVar20 = local_148 + 4;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])(int)uVar27;
      pVar50 = std::
               _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                              *)local_100,(key_type *)local_148);
      std::
      _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                      *)local_100,(_Base_ptr)pVar50.first._M_node,(_Base_ptr)pVar50.second._M_node);
      uVar31 = (int)uVar27 + 1;
      uVar27 = (ulong)uVar31;
    } while (uVar26 != uVar31);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)puVar20);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_100);
  local_100._8_8_ = local_100._8_8_ & 0xffffffff00000000;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_e8 = (_Base_ptr)(local_100 + 8);
  local_d8 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_e0 = p_Stack_e8;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar26 = 0;
    do {
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar26;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar26 + 1;
      *puVar13 = uVar31;
      lVar9 = (ulong)(uVar26 & 0xff) * 0x101010101010101;
      auStack_144._0_4_ = (undefined4)lVar9;
      auStack_144._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
      local_148 = (undefined1  [4])uVar26;
      auStack_144._8_4_ = auStack_144._0_4_;
      pVar50 = std::
               _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                              *)local_100,(key_type *)local_148);
      std::
      _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                      *)local_100,(_Base_ptr)pVar50.first._M_node,(_Base_ptr)pVar50.second._M_node);
      uVar26 = uVar31;
    } while (uVar31 != (uint)local_90);
  }
  auVar49 = std::chrono::_V2::steady_clock::now();
  uVar26 = (uint)local_90;
  report("map_toggle",(double)(auVar49._0_8_ - lVar8),uVar26,auVar49._8_8_,(size_t)puVar20);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_100);
  local_100._8_8_ = local_100._8_8_ & 0xffffffff00000000;
  local_f0._M_nxt = (_Hash_node_base *)0x0;
  p_Var2 = (_Rb_tree_node_base *)(local_100 + 8);
  local_d8 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  p_Stack_e8 = p_Var2;
  local_e0 = p_Var2;
  std::chrono::_V2::steady_clock::now();
  if (0 < (int)uVar26) {
    uVar31 = 0;
    do {
      lVar8 = (ulong)(uVar31 & 0xff) * 0x101010101010101;
      puVar20 = local_148 + 4;
      auStack_144._0_4_ = (undefined4)lVar8;
      auStack_144._4_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      auStack_144._8_4_ = auStack_144._0_4_;
      local_148 = (undefined1  [4])uVar31;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_100,(key_type *)local_148);
      uVar31 = uVar31 + 1;
      *puVar13 = uVar31;
    } while (uVar26 != uVar31);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  uVar31 = 1;
  p_Var16 = p_Stack_e8;
  while (p_Var16 != p_Var2) {
    uVar31 = uVar31 ^ *(uint *)&p_Var16[1]._M_left;
    p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar31);
  report("map_iterate",(double)(lVar9 - lVar8),uVar26,start_memory_06,(size_t)puVar20);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_100);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}